

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<float,int>
               (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  iVar1 = Xc_indptr[col_num + 1];
  lVar5 = (long)iVar1;
  iVar2 = Xc_indptr[col_num];
  lVar4 = (long)iVar2;
  if ((ulong)(lVar5 - lVar4) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar6 = 0.0;
    dVar8 = 0.0;
  }
  else {
    dVar8 = INFINITY;
    dVar6 = -INFINITY;
  }
  if (missing_action == Fail) {
    dVar7 = dVar6;
    dVar9 = dVar8;
    if (iVar2 < iVar1) {
      do {
        dVar6 = (double)Xc[lVar4];
        dVar8 = dVar6;
        if (dVar9 <= dVar6) {
          dVar8 = dVar9;
        }
        if (dVar6 <= dVar7) {
          dVar6 = dVar7;
        }
        lVar4 = lVar4 + 1;
        dVar7 = dVar6;
        dVar9 = dVar8;
      } while (lVar5 != lVar4);
      *xmin = dVar8;
      *xmax = dVar6;
    }
  }
  else if (iVar2 < iVar1) {
    do {
      if (ABS(Xc[lVar4]) != INFINITY) {
        dVar9 = (double)Xc[lVar4];
        dVar7 = dVar9;
        if (dVar8 <= dVar9) {
          dVar7 = dVar8;
        }
        dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar9);
        *xmin = dVar8;
        dVar7 = dVar9;
        if (dVar9 <= dVar6) {
          dVar7 = dVar6;
        }
        dVar6 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar7 | -(ulong)NAN(dVar6) & (ulong)dVar9);
        *xmax = dVar6;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  bVar3 = true;
  if (((dVar8 != dVar6) || (NAN(dVar8) || NAN(dVar6))) && (dVar6 != -INFINITY || dVar8 != INFINITY))
  {
    bVar3 = NAN(dVar6);
  }
  *unsplittable = bVar3;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}